

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# learn.cc
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  pointer pbVar4;
  Options OVar5;
  bool bVar6;
  OptionAdder *pOVar7;
  size_t sVar8;
  ostream *poVar9;
  OptionValue *pOVar10;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar11;
  long lVar12;
  char **ppcVar13;
  SentencePieceLearner *this;
  void *pvVar14;
  bool *pbVar15;
  int *piVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar17;
  ulong uVar18;
  int iVar19;
  ulong uVar20;
  pointer pbVar21;
  ofstream *poVar22;
  undefined8 in_stack_fffffffffffff448;
  string in_stack_fffffffffffff458;
  int iVar23;
  undefined4 in_stack_fffffffffffff47c;
  undefined1 in_stack_fffffffffffff480 [24];
  _Alloc_hider in_stack_fffffffffffff498;
  pointer in_stack_fffffffffffff4a0;
  undefined8 in_stack_fffffffffffff4a8;
  undefined8 in_stack_fffffffffffff4b0;
  _Alloc_hider in_stack_fffffffffffff4b8;
  _Alloc_hider _Var24;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_stack_fffffffffffff4c0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var25;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  in_stack_fffffffffffff4c8;
  undefined8 in_stack_fffffffffffff4e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  subword_args;
  string local_ae8;
  string local_ac8;
  string local_aa8;
  string local_a88;
  element_type *local_a68;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_a60;
  shared_ptr<const_cxxopts::Value> local_a58;
  shared_ptr<const_cxxopts::Value> local_a48;
  element_type *local_a38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_a30;
  shared_ptr<const_cxxopts::Value> local_a28;
  long *local_a18;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a10;
  long *local_a08;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a00;
  long *local_9f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_9f0;
  long *local_9e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_9e0;
  shared_ptr<const_cxxopts::Value> local_9d8 [2];
  string local_9b8;
  string local_998;
  element_type *local_978;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_970 [3];
  ParseResult subvm;
  shared_ptr<const_cxxopts::Value> local_8b8 [2];
  string local_898;
  element_type *local_878;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_870;
  shared_ptr<const_cxxopts::Value> local_868;
  element_type *local_858;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_850;
  shared_ptr<const_cxxopts::Value> local_848;
  element_type *local_838;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_830;
  ParseResult vm;
  string local_788;
  string local_768;
  string local_748;
  string local_728;
  string local_708;
  string local_6e8;
  string local_6c8;
  string local_6a8;
  string local_688;
  string local_668;
  string local_648;
  string local_628;
  string local_608;
  string local_5e8;
  string local_5c8;
  string local_5a8;
  string local_588;
  string local_568;
  string local_548;
  ofstream outputFile;
  _Alloc_hider a_Stack_520 [3];
  uint auStack_508 [124];
  Tokenizer tokenizer;
  Options cmd_options;
  Options local_d8;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_548,"subword_learn",(allocator<char> *)&outputFile);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_568,
             "Subword learning script.\n\nsubword_learn [TOKENIZATION_OPTIONS...] -- [SUBWORD_TYPE] [SUBWORD_OPTIONS...] < input_file > output_file\n"
             ,(allocator<char> *)&tokenizer);
  cxxopts::Options::Options(&cmd_options,&local_548,&local_568);
  std::__cxx11::string::~string((string *)&local_568);
  std::__cxx11::string::~string((string *)&local_548);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_588,"",(allocator<char> *)&local_978);
  cxxopts::Options::add_options((OptionAdder *)&outputFile,&cmd_options,&local_588);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tokenizer,"h,help",(allocator<char> *)&local_a88);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vm,"Show this help",(allocator<char> *)&local_998);
  cxxopts::value<bool>();
  _Var24._M_p = (pointer)0x0;
  _Var25._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5a8,"",(allocator<char> *)local_9d8);
  pOVar7 = cxxopts::OptionAdder::operator()
                     ((OptionAdder *)&outputFile,(string *)&tokenizer,(string *)&vm,
                      (shared_ptr<const_cxxopts::Value> *)&stack0xfffffffffffff4d8,&local_5a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&subvm,"v,verbose",(allocator<char> *)&local_898);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffff458,"Enable verbose output",
             (allocator<char> *)&local_9b8);
  cxxopts::value<bool>();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffff498,"false",(allocator<char> *)local_8b8);
  (**(code **)(*(long *)local_ac8._M_dataplus._M_p + 0x50))
            (&local_aa8,local_ac8._M_dataplus._M_p,&stack0xfffffffffffff498);
  local_ae8._M_dataplus._M_p = local_aa8._M_dataplus._M_p;
  local_ae8._M_string_length = local_aa8._M_string_length;
  local_aa8._M_dataplus._M_p = (pointer)0x0;
  local_aa8._M_string_length = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5c8,"",(allocator<char> *)&subword_args);
  cxxopts::OptionAdder::operator()
            (pOVar7,(string *)&subvm,(string *)&stack0xfffffffffffff458,
             (shared_ptr<const_cxxopts::Value> *)&local_ae8,&local_5c8);
  std::__cxx11::string::~string((string *)&local_5c8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_ae8._M_string_length);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_aa8._M_string_length);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffff498);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_ac8._M_string_length);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffff458);
  std::__cxx11::string::~string((string *)&subvm);
  std::__cxx11::string::~string((string *)&local_5a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xfffffffffffff4e0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xfffffffffffff4c0);
  std::__cxx11::string::~string((string *)&vm);
  std::__cxx11::string::~string((string *)&tokenizer);
  std::__cxx11::string::~string((string *)a_Stack_520);
  std::__cxx11::string::~string((string *)&local_588);
  add_tokenization_options(&cmd_options);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5e8,"Subword learning",(allocator<char> *)&local_a28);
  cxxopts::Options::add_options((OptionAdder *)&outputFile,&cmd_options,&local_5e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&tokenizer,"i,input",(allocator<char> *)&local_a38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vm,"Input files (if not set, the standard input is used)",
             (allocator<char> *)&local_a48);
  cxxopts::value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>();
  local_ac8._M_dataplus._M_p = (pointer)local_978;
  local_ac8._M_string_length = (size_type)a_Stack_970[0]._M_pi;
  local_978 = (element_type *)0x0;
  a_Stack_970[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_608,"",(allocator<char> *)&local_838);
  pOVar7 = cxxopts::OptionAdder::operator()
                     ((OptionAdder *)&outputFile,(string *)&tokenizer,(string *)&vm,
                      (shared_ptr<const_cxxopts::Value> *)&local_ac8,&local_608);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&subvm,"o,output",(allocator<char> *)&local_9e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffff458,
             "Output file (if not set, the standard output is used)",(allocator<char> *)&local_a58);
  cxxopts::value<std::__cxx11::string>();
  local_a88._M_dataplus._M_p = local_998._M_dataplus._M_p;
  local_a88._M_string_length = local_998._M_string_length;
  local_998._M_dataplus._M_p = (pointer)0x0;
  local_998._M_string_length = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_628,"",(allocator<char> *)&local_a68);
  pOVar7 = cxxopts::OptionAdder::operator()
                     (pOVar7,(string *)&subvm,(string *)&stack0xfffffffffffff458,
                      (shared_ptr<const_cxxopts::Value> *)&local_a88,&local_628);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffff498,"tmpfile",(allocator<char> *)&local_9f8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffff4d8,"Temporary file for file-based learner",
             (allocator<char> *)&local_848);
  cxxopts::value<std::__cxx11::string>();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffff4b8,"input.tmp",(allocator<char> *)&local_858);
  (**(code **)(*(long *)local_9b8._M_dataplus._M_p + 0x50))
            (&local_898,local_9b8._M_dataplus._M_p,&stack0xfffffffffffff4b8);
  local_9d8[0].super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)local_898._M_dataplus._M_p;
  local_9d8[0].super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_898._M_string_length;
  local_898._M_dataplus._M_p = (pointer)0x0;
  local_898._M_string_length = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_648,"",(allocator<char> *)&local_a08);
  pOVar7 = cxxopts::OptionAdder::operator()
                     (pOVar7,(string *)&stack0xfffffffffffff498,(string *)&stack0xfffffffffffff4d8,
                      local_9d8,&local_648);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_ae8,"subword",(allocator<char> *)&local_868);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_aa8,"Arguments for subword learner",(allocator<char> *)&local_878);
  cxxopts::value<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>();
  local_8b8[0].super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)
       subword_args.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_8b8[0].super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          subword_args.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish;
  subword_args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  subword_args.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_668,"",(allocator<char> *)&local_a18);
  cxxopts::OptionAdder::operator()(pOVar7,&local_ae8,&local_aa8,local_8b8,&local_668);
  std::__cxx11::string::~string((string *)&local_668);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_8b8[0].super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &subword_args.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish);
  std::__cxx11::string::~string((string *)&local_aa8);
  std::__cxx11::string::~string((string *)&local_ae8);
  std::__cxx11::string::~string((string *)&local_648);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_9d8[0].super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_898._M_string_length);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffff4b8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_9b8._M_string_length);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffff4d8);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffff498);
  std::__cxx11::string::~string((string *)&local_628);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_a88._M_string_length);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_998._M_string_length);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffff458);
  std::__cxx11::string::~string((string *)&subvm);
  std::__cxx11::string::~string((string *)&local_608);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_ac8._M_string_length);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(a_Stack_970);
  std::__cxx11::string::~string((string *)&vm);
  std::__cxx11::string::~string((string *)&tokenizer);
  std::__cxx11::string::~string((string *)a_Stack_520);
  std::__cxx11::string::~string((string *)&local_5e8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_688,"subword",(allocator<char> *)&outputFile);
  cxxopts::Options::parse_positional(&cmd_options,&local_688);
  ppcVar13 = argv;
  iVar23 = argc;
  std::__cxx11::string::~string((string *)&local_688);
  cxxopts::Options::parse(&vm,&cmd_options,argc,argv);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&outputFile,"help",(allocator<char> *)&tokenizer);
  sVar8 = cxxopts::ParseResult::count(&vm,(string *)&outputFile);
  std::__cxx11::string::~string((string *)&outputFile);
  if (sVar8 != 0) {
    _tokenizer = (pointer)0x0;
    cxxopts::Options::help
              ((string *)&outputFile,&cmd_options,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&tokenizer);
    poVar9 = std::operator<<((ostream *)&std::cout,(string *)&outputFile);
    std::endl<char,std::char_traits<char>>(poVar9);
    std::__cxx11::string::~string((string *)&outputFile);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&tokenizer);
    iVar19 = 0;
    goto LAB_0010de84;
  }
  build_tokenization_options(&local_d8,&vm);
  _outputFile = (pointer)0x0;
  a_Stack_520[0]._M_p = (pointer)0x0;
  OVar5.lang._M_dataplus._M_p = (pointer)ppcVar13;
  OVar5._0_8_ = in_stack_fffffffffffff448;
  OVar5._16_32_ = in_stack_fffffffffffff458;
  OVar5.joiner._M_dataplus._M_p._0_4_ = iVar23;
  OVar5.joiner._M_dataplus._M_p._4_4_ = in_stack_fffffffffffff47c;
  OVar5.joiner._M_string_length = in_stack_fffffffffffff480._0_8_;
  OVar5.joiner.field_2 =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        )in_stack_fffffffffffff480._8_16_;
  OVar5._80_8_ = in_stack_fffffffffffff498._M_p;
  OVar5.segment_alphabet.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = in_stack_fffffffffffff4a0;
  OVar5.segment_alphabet.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffff4a8;
  OVar5.segment_alphabet.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffff4b0;
  OVar5.segment_alphabet_codes._M_h._M_buckets = (__buckets_ptr)_Var24._M_p;
  OVar5.segment_alphabet_codes._M_h._M_bucket_count = (size_type)_Var25._M_pi;
  OVar5.segment_alphabet_codes._M_h._16_16_ = in_stack_fffffffffffff4c8;
  OVar5.segment_alphabet_codes._M_h._M_rehash_policy._0_8_ = in_stack_fffffffffffff4b8._M_p;
  OVar5.segment_alphabet_codes._M_h._M_rehash_policy._M_next_resize =
       (size_t)in_stack_fffffffffffff4c0._M_pi;
  OVar5.segment_alphabet_codes._M_h._M_single_bucket = (__node_base_ptr)in_stack_fffffffffffff4e8;
  onmt::Tokenizer::Tokenizer(&tokenizer,OVar5,(shared_ptr *)&local_d8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)a_Stack_520);
  onmt::Tokenizer::Options::~Options(&local_d8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&outputFile,"subword",(allocator<char> *)&subvm);
  pOVar10 = cxxopts::ParseResult::operator[](&vm,(string *)&outputFile);
  pvVar11 = cxxopts::OptionValue::
            as<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>(pOVar10);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&subword_args,pvVar11);
  std::__cxx11::string::~string((string *)&outputFile);
  pbVar21 = subword_args.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  bVar6 = std::operator==(subword_args.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start,"bpe");
  if (bVar6) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6a8,"subword_learn [OPTION...] -- bpe",(allocator<char> *)&subvm);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6c8,"",(allocator<char> *)&stack0xfffffffffffff458);
    cxxopts::Options::Options((Options *)&outputFile,&local_6a8,&local_6c8);
    std::__cxx11::string::~string((string *)&local_6c8);
    std::__cxx11::string::~string((string *)&local_6a8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6e8,"",(allocator<char> *)&stack0xfffffffffffff497);
    cxxopts::Options::add_options((OptionAdder *)&subvm,(Options *)&outputFile,&local_6e8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&stack0xfffffffffffff458,"h,help",
               (allocator<char> *)&stack0xfffffffffffff496);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&stack0xfffffffffffff498,"Show this help",
               (allocator<char> *)&stack0xfffffffffffff495);
    cxxopts::value<bool>();
    local_a28.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_a38;
    local_a28.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = _Stack_a30._M_pi;
    local_a38 = (element_type *)0x0;
    _Stack_a30._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_708,"",(allocator<char> *)&stack0xfffffffffffff494);
    pOVar7 = cxxopts::OptionAdder::operator()
                       ((OptionAdder *)&subvm,(string *)&stack0xfffffffffffff458,
                        (string *)&stack0xfffffffffffff498,&local_a28,&local_708);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&stack0xfffffffffffff4d8,"s,symbols",
               (allocator<char> *)&stack0xfffffffffffff493);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&stack0xfffffffffffff4b8,
               "Create this many new symbols (each representing a character n-gram)",
               (allocator<char> *)&stack0xfffffffffffff492);
    cxxopts::value<int>();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_ae8,"10000",(allocator<char> *)&stack0xfffffffffffff491);
    (**(code **)(*local_9e8 + 0x50))(&local_838,local_9e8,&local_ae8);
    local_a48.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_838;
    local_a48.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = _Stack_830._M_pi;
    local_838 = (element_type *)0x0;
    _Stack_830._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_728,"",(allocator<char> *)&stack0xfffffffffffff490);
    pOVar7 = cxxopts::OptionAdder::operator()
                       (pOVar7,(string *)&stack0xfffffffffffff4d8,(string *)&stack0xfffffffffffff4b8
                        ,&local_a48,&local_728);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_aa8,"min-frequency",(allocator<char> *)&stack0xfffffffffffff48f);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_ac8,"Stop if no symbol pair has frequency >= FREQ",
               (allocator<char> *)&stack0xfffffffffffff48e);
    cxxopts::value<int>();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_978,"2",(allocator<char> *)&stack0xfffffffffffff48d);
    (**(code **)(*local_9f8 + 0x50))(&local_a68,local_9f8,&local_978);
    local_a58.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_a68;
    local_a58.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = _Stack_a60._M_pi;
    local_a68 = (element_type *)0x0;
    _Stack_a60._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_748,"",(allocator<char> *)&stack0xfffffffffffff48c);
    pOVar7 = cxxopts::OptionAdder::operator()(pOVar7,&local_aa8,&local_ac8,&local_a58,&local_748);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a88,"dict-input",(allocator<char> *)&stack0xfffffffffffff48b);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_998,
               "If set, input file is interpreted as a dictionary where each line contains a word-count pair"
               ,(allocator<char> *)&stack0xfffffffffffff48a);
    cxxopts::value<bool>();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_9d8,"false",(allocator<char> *)&stack0xfffffffffffff489);
    (**(code **)(*local_a08 + 0x50))(&local_858,local_a08,local_9d8);
    local_848.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_858;
    local_848.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = _Stack_850._M_pi;
    local_858 = (element_type *)0x0;
    _Stack_850._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_768,"",(allocator<char> *)&stack0xfffffffffffff488);
    pOVar7 = cxxopts::OptionAdder::operator()(pOVar7,&local_a88,&local_998,&local_848,&local_768);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_898,"t,total-symbols",(allocator<char> *)&stack0xfffffffffffff487);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_9b8,
               "Subtract number of characters from the symbols to be generated (so that \'--symbols\' becomes an estimate for the total number of symbols needed to encode text)"
               ,(allocator<char> *)&stack0xfffffffffffff486);
    cxxopts::value<bool>();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_8b8,"false",(allocator<char> *)&stack0xfffffffffffff485);
    (**(code **)(*local_a18 + 0x50))(&local_878,local_a18,local_8b8);
    local_868.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_878;
    local_868.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = _Stack_870._M_pi;
    local_878 = (element_type *)0x0;
    _Stack_870._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_788,"",(allocator<char> *)&stack0xfffffffffffff484);
    cxxopts::OptionAdder::operator()(pOVar7,&local_898,&local_9b8,&local_868,&local_788);
    std::__cxx11::string::~string((string *)&local_788);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_868.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_870);
    std::__cxx11::string::~string((string *)local_8b8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a10);
    std::__cxx11::string::~string((string *)&local_9b8);
    std::__cxx11::string::~string((string *)&local_898);
    std::__cxx11::string::~string((string *)&local_768);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_848.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_850);
    std::__cxx11::string::~string((string *)local_9d8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a00);
    std::__cxx11::string::~string((string *)&local_998);
    std::__cxx11::string::~string((string *)&local_a88);
    std::__cxx11::string::~string((string *)&local_748);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_a58.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_a60);
    std::__cxx11::string::~string((string *)&local_978);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_9f0);
    std::__cxx11::string::~string((string *)&local_ac8);
    std::__cxx11::string::~string((string *)&local_aa8);
    std::__cxx11::string::~string((string *)&local_728);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_a48.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_830);
    std::__cxx11::string::~string((string *)&local_ae8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_9e0);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffff4b8);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffff4d8);
    std::__cxx11::string::~string((string *)&local_708);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_a28.super___shared_ptr<const_cxxopts::Value,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_a30);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffff498);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffff458);
    std::__cxx11::string::~string((string *)&subvm.m_keys._M_h._M_bucket_count);
    std::__cxx11::string::~string((string *)&local_6e8);
    pbVar21 = subword_args.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar20 = (long)subword_args.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)subword_args.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
    lVar12 = uVar20 * 0x8000000;
    uVar18 = 0xffffffffffffffff;
    if (-1 < lVar12) {
      uVar18 = lVar12 >> 0x1d;
    }
    ppcVar13 = (char **)operator_new__(uVar18);
    uVar20 = uVar20 >> 5;
    lVar12 = 0;
    iVar19 = (int)uVar20;
    uVar18 = 0;
    if (0 < iVar19) {
      uVar18 = uVar20 & 0xffffffff;
    }
    for (; uVar18 * 8 != lVar12; lVar12 = lVar12 + 8) {
      *(undefined8 *)((long)ppcVar13 + lVar12) =
           *(undefined8 *)((long)&(pbVar21->_M_dataplus)._M_p + lVar12 * 4);
    }
    cxxopts::Options::parse(&subvm,(Options *)&outputFile,iVar19,ppcVar13);
    operator_delete__(ppcVar13);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&stack0xfffffffffffff458,"help",(allocator<char> *)&stack0xfffffffffffff498
              );
    sVar8 = cxxopts::ParseResult::count(&subvm,(string *)&stack0xfffffffffffff458);
    std::__cxx11::string::~string((string *)&stack0xfffffffffffff458);
    if (sVar8 == 0) {
      pvVar14 = operator_new(0x68);
      iVar23 = (int)pvVar14;
      in_stack_fffffffffffff47c = (undefined4)((ulong)pvVar14 >> 0x20);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&stack0xfffffffffffff458,"verbose",(allocator<char> *)&local_aa8);
      pOVar10 = cxxopts::ParseResult::operator[](&vm,(string *)&stack0xfffffffffffff458);
      pbVar15 = cxxopts::OptionValue::as<bool>(pOVar10);
      bVar6 = *pbVar15;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&stack0xfffffffffffff498,"symbols",(allocator<char> *)&local_ac8);
      pOVar10 = cxxopts::ParseResult::operator[](&subvm,(string *)&stack0xfffffffffffff498);
      piVar16 = cxxopts::OptionValue::as<int>(pOVar10);
      iVar19 = *piVar16;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&stack0xfffffffffffff4d8,"min-frequency",(allocator<char> *)&local_978);
      pOVar10 = cxxopts::ParseResult::operator[](&subvm,(string *)&stack0xfffffffffffff4d8);
      piVar16 = cxxopts::OptionValue::as<int>(pOVar10);
      iVar2 = *piVar16;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&stack0xfffffffffffff4b8,"dict-input",(allocator<char> *)&local_a88);
      pOVar10 = cxxopts::ParseResult::operator[](&subvm,(string *)&stack0xfffffffffffff4b8);
      pbVar15 = cxxopts::OptionValue::as<bool>(pOVar10);
      bVar1 = *pbVar15;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_ae8,"total-symbols",(allocator<char> *)&local_998);
      pOVar10 = cxxopts::ParseResult::operator[](&subvm,&local_ae8);
      pbVar15 = cxxopts::OptionValue::as<bool>(pOVar10);
      onmt::BPELearner::BPELearner
                ((BPELearner *)CONCAT44(in_stack_fffffffffffff47c,iVar23),bVar6,iVar19,iVar2,bVar1,
                 *pbVar15);
      std::__cxx11::string::~string((string *)&local_ae8);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffff4b8);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffff4d8);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffff498);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffff458);
    }
    else {
      cxxopts::Options::help
                ((string *)&stack0xfffffffffffff458,(Options *)&outputFile,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&stack0xfffffffffffff498);
      poVar9 = std::operator<<((ostream *)&std::cout,(string *)&stack0xfffffffffffff458);
      std::endl<char,std::char_traits<char>>(poVar9);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffff458);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&stack0xfffffffffffff498);
    }
    cxxopts::ParseResult::~ParseResult(&subvm);
    cxxopts::Options::~Options((Options *)&outputFile);
    iVar19 = 0;
    if (sVar8 == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&outputFile,"input",(allocator<char> *)&subvm);
      sVar8 = cxxopts::ParseResult::count(&vm,(string *)&outputFile);
      std::__cxx11::string::~string((string *)&outputFile);
      if (sVar8 == 0) {
        iVar19 = 0;
        (**(code **)(*(long *)CONCAT44(in_stack_fffffffffffff47c,iVar23) + 0x28))
                  ((long *)CONCAT44(in_stack_fffffffffffff47c,iVar23),&std::cin,&tokenizer);
LAB_0010dd16:
        std::ofstream::ofstream(&outputFile);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&subvm,"output",(allocator<char> *)&stack0xfffffffffffff458);
        sVar8 = cxxopts::ParseResult::count(&vm,(string *)&subvm);
        std::__cxx11::string::~string((string *)&subvm);
        if (sVar8 == 0) {
          poVar22 = (ofstream *)&std::cout;
LAB_0010de44:
          iVar19 = 0;
          (**(code **)(*(long *)CONCAT44(in_stack_fffffffffffff47c,iVar23) + 0x30))
                    ((long *)CONCAT44(in_stack_fffffffffffff47c,iVar23),poVar22,
                     "Generated with subword_learn cli",0);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&stack0xfffffffffffff458,"output",
                     (allocator<char> *)&stack0xfffffffffffff498);
          pOVar10 = cxxopts::ParseResult::operator[](&vm,(string *)&stack0xfffffffffffff458);
          pbVar17 = cxxopts::OptionValue::as<std::__cxx11::string>(pOVar10);
          std::__cxx11::string::string((string *)&subvm,(string *)pbVar17);
          std::__cxx11::string::~string((string *)&stack0xfffffffffffff458);
          poVar22 = &outputFile;
          std::ofstream::open((char *)poVar22,(_Ios_Openmode)subvm.m_keys._M_h._M_buckets);
          uVar3 = *(uint *)((long)auStack_508 + *(long *)(_outputFile + -0x18));
          if ((uVar3 & 5) != 0) {
            poVar22 = (ofstream *)&std::cout;
            poVar9 = std::operator<<((ostream *)&std::cout,"ERROR: cannot open file ");
            poVar9 = std::operator<<(poVar9,(string *)&subvm);
            poVar9 = std::operator<<(poVar9," for writing ");
            std::endl<char,std::char_traits<char>>(poVar9);
            iVar19 = 1;
          }
          std::__cxx11::string::~string((string *)&subvm);
          if ((uVar3 & 5) == 0) goto LAB_0010de44;
        }
        std::ofstream::~ofstream(&outputFile);
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&outputFile,"input",(allocator<char> *)&subvm);
        pOVar10 = cxxopts::ParseResult::operator[](&vm,(string *)&outputFile);
        pvVar11 = cxxopts::OptionValue::
                  as<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                            (pOVar10);
        std::__cxx11::string::~string((string *)&outputFile);
        pbVar21 = (pvVar11->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        pbVar4 = (pvVar11->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        iVar19 = 0;
        do {
          if (pbVar21 == pbVar4) goto LAB_0010dd16;
          poVar9 = std::operator<<((ostream *)&std::cerr,"Parsing ");
          poVar9 = std::operator<<(poVar9,(string *)pbVar21);
          poVar9 = std::operator<<(poVar9,"...");
          std::endl<char,std::char_traits<char>>(poVar9);
          std::ifstream::ifstream((string *)&outputFile);
          std::ifstream::open((char *)&outputFile,(_Ios_Openmode)(pbVar21->_M_dataplus)._M_p);
          std::istream::seekg((string *)&outputFile,0,0);
          iVar2 = *(int *)((long)auStack_508 + *(long *)(_outputFile + -0x18));
          if (iVar2 == 0) {
            (**(code **)(*(long *)CONCAT44(in_stack_fffffffffffff47c,iVar23) + 0x28))
                      ((long *)CONCAT44(in_stack_fffffffffffff47c,iVar23),(string *)&outputFile,
                       &tokenizer);
          }
          else {
            poVar9 = std::operator<<((ostream *)&std::cout,"ERROR: cannot open file ");
            poVar9 = std::operator<<(poVar9,(string *)pbVar21);
            poVar9 = std::operator<<(poVar9," for reading ");
            std::endl<char,std::char_traits<char>>(poVar9);
            iVar19 = 1;
          }
          std::ifstream::~ifstream((string *)&outputFile);
          pbVar21 = pbVar21 + 1;
        } while (iVar2 == 0);
      }
    }
  }
  else {
    iVar19 = 1;
    bVar6 = std::operator==(pbVar21,"sentencepiece");
    if (bVar6) {
      this = (SentencePieceLearner *)operator_new(0x78);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&outputFile,"verbose",(allocator<char> *)&stack0xfffffffffffff498);
      pOVar10 = cxxopts::ParseResult::operator[](&vm,(string *)&outputFile);
      pbVar15 = cxxopts::OptionValue::as<bool>(pOVar10);
      bVar6 = *pbVar15;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      vector<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,void>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 &stack0xfffffffffffff458,
                 subword_args.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 1,
                 (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  )subword_args.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish,
                 (allocator_type *)&stack0xfffffffffffff4d8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&subvm,"tmpfile",(allocator<char> *)&stack0xfffffffffffff4b8);
      pOVar10 = cxxopts::ParseResult::operator[](&vm,(string *)&subvm);
      pbVar17 = cxxopts::OptionValue::as<std::__cxx11::string>(pOVar10);
      onmt::SentencePieceLearner::SentencePieceLearner
                (this,bVar6,(vector *)&stack0xfffffffffffff458,(string *)pbVar17,false,false);
      std::__cxx11::string::~string((string *)&subvm);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&stack0xfffffffffffff458);
      std::__cxx11::string::~string((string *)&outputFile);
    }
    else {
      poVar9 = std::operator<<((ostream *)&std::cerr,"ERROR: invalid subword type: ");
      poVar9 = std::operator<<(poVar9,(string *)pbVar21);
      poVar9 = std::operator<<(poVar9," (accepted: bpe, sentencepiece)");
      std::endl<char,std::char_traits<char>>(poVar9);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&subword_args);
  onmt::Tokenizer::~Tokenizer(&tokenizer);
LAB_0010de84:
  cxxopts::ParseResult::~ParseResult(&vm);
  cxxopts::Options::~Options(&cmd_options);
  return iVar19;
}

Assistant:

int main(int argc, char* argv[])
{
  cxxopts::Options cmd_options("subword_learn",
                               "Subword learning script.\n\nsubword_learn "
                               "[TOKENIZATION_OPTIONS...] -- [SUBWORD_TYPE] "
                               "[SUBWORD_OPTIONS...] < input_file > output_file\n");
  cmd_options.add_options()
    ("h,help", "Show this help")
    ("v,verbose", "Enable verbose output",
     cxxopts::value<bool>()->default_value("false"))
    ;

  add_tokenization_options(cmd_options);

  cmd_options.add_options("Subword learning")
    ("i,input", "Input files (if not set, the standard input is used)",
     cxxopts::value<std::vector<std::string>>())
    ("o,output", "Output file (if not set, the standard output is used)",
     cxxopts::value<std::string>())
    ("tmpfile", "Temporary file for file-based learner",
     cxxopts::value<std::string>()->default_value("input.tmp"))
    ("subword", "Arguments for subword learner",
     cxxopts::value<std::vector<std::string>>());

  cmd_options.parse_positional("subword");

  auto vm = cmd_options.parse(argc, argv);

  if (vm.count("help"))
  {
    std::cout << cmd_options.help() << std::endl;
    return 0;
  }

  onmt::Tokenizer tokenizer(build_tokenization_options(vm));
  onmt::SubwordLearner *learner;

  const auto subword_args = vm["subword"].as<std::vector<std::string>>();
  const auto& subword = subword_args[0];
  if (subword == "bpe")
  {
    cxxopts::Options bpe_options("subword_learn [OPTION...] -- bpe");
    bpe_options.add_options()
      ("h,help", "Show this help")
      ("s,symbols", "Create this many new symbols (each representing a character n-gram)",
       cxxopts::value<int>()->default_value("10000"))
      ("min-frequency", "Stop if no symbol pair has frequency >= FREQ",
       cxxopts::value<int>()->default_value("2"))
      ("dict-input",
       "If set, input file is interpreted as a dictionary where each line "
       "contains a word-count pair",
       cxxopts::value<bool>()->default_value("false"))
      ("t,total-symbols",
       "Subtract number of characters from the symbols to be generated "
       "(so that '--symbols' becomes an estimate for the total number of "
       "symbols needed to encode text)",
       cxxopts::value<bool>()->default_value("false"))
      ;

    // Parse BPE options only.
    int subargc = subword_args.size();
    char** subargv = new char*[subargc];
    for (int i = 0; i < subargc; ++i)
      subargv[i] = const_cast<char*>(subword_args[i].c_str());
    auto subvm = bpe_options.parse(subargc, subargv);
    delete [] subargv;

    if (subvm.count("help"))
    {
      std::cout << bpe_options.help() << std::endl;
      return 0;
    }

    learner = new onmt::BPELearner(vm["verbose"].as<bool>(),
                                   subvm["symbols"].as<int>(),
                                   subvm["min-frequency"].as<int>(),
                                   subvm["dict-input"].as<bool>(),
                                   subvm["total-symbols"].as<bool>());

  }
  else if (subword == "sentencepiece") {
    learner = new onmt::SentencePieceLearner(vm["verbose"].as<bool>(),
                                             std::vector<std::string>(subword_args.begin() + 1,
                                                                      subword_args.end()),
                                             vm["tmpfile"].as<std::string>());
    return 1;
  }
  else {
    std::cerr << "ERROR: invalid subword type: " << subword << " (accepted: bpe, sentencepiece)" << std::endl;
    return 1;
  }

  if (vm.count("input")) {
    for(const std::string &inputFileName: vm["input"].as<std::vector<std::string> >()) {
      std::cerr << "Parsing " << inputFileName << "..." << std::endl;
      std::ifstream inputFile;
      inputFile.open(inputFileName.c_str());
      inputFile.seekg(0);
      if (inputFile.fail() || !inputFile.good()) {
        std::cout << "ERROR: cannot open file " << inputFileName << " for reading " << std::endl;
        return 1;
      }
      learner->ingest(inputFile, &tokenizer);
    }
  } else
    learner->ingest(std::cin, &tokenizer);

  std::ostream* pCout = &std::cout;
  std::ofstream outputFile;
  if (vm.count("output")) {
    std::string outputFileName = vm["output"].as<std::string>();
    outputFile.open(outputFileName.c_str());
    if (outputFile.fail()) {
      std::cout << "ERROR: cannot open file " << outputFileName << " for writing " << std::endl;
      return 1;
    }
    pCout = &outputFile;
  }
  learner->learn(*pCout, "Generated with subword_learn cli");

  return 0;
}